

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-CTA-cs16btech11038.cpp
# Opt level: O0

void __thiscall FOCC_CTA::~FOCC_CTA(FOCC_CTA *this)

{
  DataItem *this_00;
  bool bVar1;
  reference ppDVar2;
  DataItem *e;
  iterator __end1;
  iterator __begin1;
  vector<DataItem_*,_std::allocator<DataItem_*>_> *__range1;
  FOCC_CTA *this_local;
  
  garbageCollect(this);
  __end1 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::begin(&this->dataItems);
  e = (DataItem *)std::vector<DataItem_*,_std::allocator<DataItem_*>_>::end(&this->dataItems);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<DataItem_**,_std::vector<DataItem_*,_std::allocator<DataItem_*>_>_>
                                *)&e);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<DataItem_**,_std::vector<DataItem_*,_std::allocator<DataItem_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppDVar2;
    if (this_00 != (DataItem *)0x0) {
      DataItem::~DataItem(this_00);
      operator_delete(this_00,0x60);
    }
    __gnu_cxx::__normal_iterator<DataItem_**,_std::vector<DataItem_*,_std::allocator<DataItem_*>_>_>
    ::operator++(&__end1);
  }
  std::
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>::
  ~map(&this->transactions);
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::~vector(&this->dataItems);
  return;
}

Assistant:

FOCC_CTA::~FOCC_CTA() {
    garbageCollect();
    for(auto e: dataItems){
        delete(e);
    }
}